

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O2

Load * __thiscall
wasm::AvoidReinterprets::optimize(wasm::Function*)::FinalOptimizer::makeReinterpretedLoad(wasm::
Load*,wasm::Expression__(void *this,Load *load,Expression *ptr)

{
  uint8_t uVar1;
  address64_t aVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  address64_t aVar6;
  Type TVar7;
  Load *pLVar8;
  
  uVar1 = load->bytes;
  aVar2 = (load->offset).addr;
  aVar6 = (load->align).addr;
  lVar3 = *(long *)((long)this + 0xe8);
  TVar7 = wasm::Type::reinterpret
                    (&(load->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                      type);
  sVar4 = (load->memory).super_IString.str._M_len;
  pcVar5 = (load->memory).super_IString.str._M_str;
  pLVar8 = MixedArena::alloc<wasm::Load>((MixedArena *)(lVar3 + 0x158));
  pLVar8->isAtomic = false;
  pLVar8->bytes = uVar1;
  pLVar8->signed_ = false;
  (pLVar8->offset).addr = aVar2;
  (pLVar8->align).addr = (ulong)(uint)aVar6;
  pLVar8->ptr = ptr;
  (pLVar8->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = TVar7.id;
  (pLVar8->memory).super_IString.str._M_len = sVar4;
  (pLVar8->memory).super_IString.str._M_str = pcVar5;
  return pLVar8;
}

Assistant:

Load* makeReinterpretedLoad(Load* load, Expression* ptr) {
        Builder builder(*module);
        return builder.makeLoad(load->bytes,
                                false,
                                load->offset,
                                load->align,
                                ptr,
                                load->type.reinterpret(),
                                load->memory);
      }